

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O3

bool __thiscall
solitaire::events::EventsProcessor::checkIfCollidesAndTryPullOutCardFromAnyFoundationPile
          (EventsProcessor *this,MouseLeftButtonDown *event)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  PileId local_2c;
  
  local_2c.t = 0;
  bVar2 = checkIfCollidesAndTryPullOutCardFromFoundationPile(this,&local_2c,event);
  bVar4 = true;
  if (!bVar2) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 3) break;
      local_2c.t = uVar3 + 1;
      bVar2 = checkIfCollidesAndTryPullOutCardFromFoundationPile(this,&local_2c,event);
      uVar1 = uVar3 + 1;
    } while (!bVar2);
    bVar4 = uVar3 < 3;
  }
  return bVar4;
}

Assistant:

bool EventsProcessor::
checkIfCollidesAndTryPullOutCardFromAnyFoundationPile(
    const MouseLeftButtonDown& event) const
{
    for (PileId id {0}; id < Solitaire::foundationPilesCount; ++id)
        if (checkIfCollidesAndTryPullOutCardFromFoundationPile(id, event))
            return true;
    return false;
}